

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_NewClass1(JSRuntime *rt,JSClassID class_id,JSClassDef *class_def,JSAtom name)

{
  int iVar1;
  JSClassGCMark *pJVar2;
  JSClassExoticMethods *pJVar3;
  list_head *plVar4;
  JSClass *pJVar5;
  long lVar6;
  uint uVar7;
  list_head **pplVar8;
  int iVar9;
  ulong uVar10;
  list_head *plVar11;
  
  iVar9 = -1;
  if (class_id < 0x10000) {
    uVar7 = rt->class_count;
    if (class_id < uVar7) {
      pJVar5 = rt->class_array;
      if (pJVar5[class_id].class_id != 0) {
        return -1;
      }
    }
    else {
      uVar7 = (uVar7 >> 1) + uVar7;
      if (uVar7 < class_id + 1) {
        uVar7 = class_id + 1;
      }
      uVar10 = 0x33;
      if (0x33 < uVar7) {
        uVar10 = (ulong)uVar7;
      }
      plVar11 = (rt->context_list).next;
      iVar9 = (int)uVar10;
      if (plVar11 != &rt->context_list) {
        do {
          plVar4 = (list_head *)
                   (*(rt->mf).js_realloc)(&rt->malloc_state,plVar11[2].prev,uVar10 << 4);
          if (plVar4 == (list_head *)0x0) {
            return -1;
          }
          iVar1 = rt->class_count;
          if (iVar1 < iVar9) {
            lVar6 = uVar10 - (long)iVar1;
            pplVar8 = &plVar4[iVar1].next;
            do {
              *(undefined4 *)&((list_head *)(pplVar8 + -1))->prev = 0;
              *pplVar8 = (list_head *)0x2;
              pplVar8 = pplVar8 + 2;
              lVar6 = lVar6 + -1;
            } while (lVar6 != 0);
          }
          plVar11[2].prev = plVar4;
          plVar11 = plVar11->next;
        } while (plVar11 != &rt->context_list);
      }
      pJVar5 = (JSClass *)(*(rt->mf).js_realloc)(&rt->malloc_state,rt->class_array,uVar10 * 0x28);
      if (pJVar5 == (JSClass *)0x0) {
        return -1;
      }
      memset(pJVar5 + rt->class_count,0,((long)iVar9 - (long)rt->class_count) * 0x28);
      rt->class_array = pJVar5;
      rt->class_count = iVar9;
    }
    pJVar5 = pJVar5 + class_id;
    pJVar5->class_id = class_id;
    if (0xd1 < (int)name) {
      (rt->atom_array[name]->header).ref_count = (rt->atom_array[name]->header).ref_count + 1;
    }
    pJVar5->class_name = name;
    pJVar2 = class_def->gc_mark;
    pJVar5->finalizer = class_def->finalizer;
    pJVar5->gc_mark = pJVar2;
    pJVar3 = class_def->exotic;
    pJVar5->call = class_def->call;
    pJVar5->exotic = pJVar3;
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

static int JS_NewClass1(JSRuntime *rt, JSClassID class_id,
                        const JSClassDef *class_def, JSAtom name)
{
    int new_size, i;
    JSClass *cl, *new_class_array;
    struct list_head *el;

    if (class_id >= (1 << 16))
        return -1;
    if (class_id < rt->class_count &&
        rt->class_array[class_id].class_id != 0)
        return -1;

    if (class_id >= rt->class_count) {
        new_size = max_int(JS_CLASS_INIT_COUNT,
                           max_int(class_id + 1, rt->class_count * 3 / 2));

        /* reallocate the context class prototype array, if any */
        list_for_each(el, &rt->context_list) {
            JSContext *ctx = list_entry(el, JSContext, link);
            JSValue *new_tab;
            new_tab = js_realloc_rt(rt, ctx->class_proto,
                                    sizeof(ctx->class_proto[0]) * new_size);
            if (!new_tab)
                return -1;
            for(i = rt->class_count; i < new_size; i++)
                new_tab[i] = JS_NULL;
            ctx->class_proto = new_tab;
        }
        /* reallocate the class array */
        new_class_array = js_realloc_rt(rt, rt->class_array,
                                        sizeof(JSClass) * new_size);
        if (!new_class_array)
            return -1;
        memset(new_class_array + rt->class_count, 0,
               (new_size - rt->class_count) * sizeof(JSClass));
        rt->class_array = new_class_array;
        rt->class_count = new_size;
    }
    cl = &rt->class_array[class_id];
    cl->class_id = class_id;
    cl->class_name = JS_DupAtomRT(rt, name);
    cl->finalizer = class_def->finalizer;
    cl->gc_mark = class_def->gc_mark;
    cl->call = class_def->call;
    cl->exotic = class_def->exotic;
    return 0;
}